

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

NodeRef * __thiscall c4::yml::Tree::operator[](NodeRef *__return_storage_ptr__,Tree *this,size_t i)

{
  code *pcVar1;
  Location LVar2;
  bool bVar3;
  size_t node;
  NodeRef *pNVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  byte bVar10;
  char msg [68];
  char local_68 [64];
  undefined4 local_28;
  
  bVar10 = 0;
  node = root_id(this);
  if (node == 0xffffffffffffffff) {
    pcVar8 = "check failed: (((ConstImpl const* __restrict__)this)->m_id != NONE)";
    pcVar9 = local_68;
    for (lVar7 = 8; lVar7 != 0; lVar7 = lVar7 + -1) {
      *(undefined8 *)pcVar9 = *(undefined8 *)pcVar8;
      pcVar8 = pcVar8 + ((ulong)bVar10 * -2 + 1) * 8;
      pcVar9 = pcVar9 + ((ulong)bVar10 * -2 + 1) * 8;
    }
    local_28 = 0x29454e;
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar1 = (code *)swi(3);
        pNVar4 = (NodeRef *)(*pcVar1)();
        return pNVar4;
      }
    }
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x50c4) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x50c4) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_68,0x44,LVar2,(this->m_callbacks).m_user_data);
  }
  sVar5 = child(this,node,i);
  __return_storage_ptr__->m_tree = this;
  if (sVar5 != 0xffffffffffffffff) {
    node = sVar5;
  }
  sVar6 = 0xffffffffffffffff;
  if (sVar5 == 0xffffffffffffffff) {
    sVar6 = i;
  }
  __return_storage_ptr__->m_id = node;
  (__return_storage_ptr__->m_seed).str = (char *)0x0;
  (__return_storage_ptr__->m_seed).len = 0;
  (__return_storage_ptr__->m_seed).len = sVar6;
  return __return_storage_ptr__;
}

Assistant:

NodeRef Tree::operator[] (size_t i)
{
    return rootref()[i];
}